

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.h
# Opt level: O0

void __thiscall
fmt::v5::
basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
::parse_flags(basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
              *this,format_specs *spec,iterator *it)

{
  char cVar1;
  null_terminating_iterator<char> *in_RDX;
  long in_RSI;
  null_terminating_iterator<char> local_28;
  null_terminating_iterator<char> *local_18;
  long local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  do {
    local_28 = internal::null_terminating_iterator<char>::operator++(local_18,0);
    cVar1 = internal::null_terminating_iterator<char>::operator*(&local_28);
    switch(cVar1) {
    case ' ':
      *(byte *)(local_10 + 0x10) = *(byte *)(local_10 + 0x10) | 1;
      break;
    default:
      internal::null_terminating_iterator<char>::operator--(local_18);
      return;
    case '#':
      *(byte *)(local_10 + 0x10) = *(byte *)(local_10 + 0x10) | 8;
      break;
    case '+':
      *(byte *)(local_10 + 0x10) = *(byte *)(local_10 + 0x10) | 3;
      break;
    case '-':
      *(undefined4 *)(local_10 + 8) = 1;
      break;
    case '0':
      *(undefined4 *)(local_10 + 4) = 0x30;
    }
  } while( true );
}

Assistant:

void basic_printf_context<OutputIt, Char, AF>::parse_flags(
    format_specs &spec, iterator &it) {
  for (;;) {
    switch (*it++) {
      case '-':
        spec.align_ = ALIGN_LEFT;
        break;
      case '+':
        spec.flags |= SIGN_FLAG | PLUS_FLAG;
        break;
      case '0':
        spec.fill_ = '0';
        break;
      case ' ':
        spec.flags |= SIGN_FLAG;
        break;
      case '#':
        spec.flags |= HASH_FLAG;
        break;
      default:
        --it;
        return;
    }
  }
}